

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O0

int nn_rep_send(nn_sockbase *self,nn_msg *msg)

{
  FILE *__stream;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  nn_sockbase *local_38;
  nn_rep *rep;
  int rc;
  nn_msg *msg_local;
  nn_sockbase *self_local;
  
  local_38 = self;
  if (self == (nn_sockbase *)0x0) {
    local_38 = (nn_sockbase *)0x0;
  }
  if (((ulong)local_38[0x1d].sock & 1) == 0) {
    self_local._4_4_ = -0x9523dfe;
  }
  else {
    sVar2 = nn_chunkref_size(&msg->sphdr);
    if (sVar2 != 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_chunkref_size (&msg->sphdr) == 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/reqrep/rep.c"
              ,0x67);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_chunkref_term(&msg->sphdr);
    nn_chunkref_mv(&msg->sphdr,(nn_chunkref *)(local_38 + 0x1e));
    *(uint *)&local_38[0x1d].sock = *(uint *)&local_38[0x1d].sock & 0xfffffffe;
    iVar1 = nn_xrep_send(local_38,msg);
    __stream = _stderr;
    if (iVar1 != 0 && iVar1 != -0xb) {
      pcVar3 = nn_err_strerror(-iVar1);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)(uint)-iVar1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/reqrep/rep.c"
              ,0x6f);
      fflush(_stderr);
      nn_err_abort();
    }
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

int nn_rep_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_rep *rep;

    rep = nn_cont (self, struct nn_rep, xrep.sockbase);

    /*  If no request was received, there's nowhere to send the reply to. */
    if (nn_slow (!(rep->flags & NN_REP_INPROGRESS)))
        return -EFSM;

    /*  Move the stored backtrace into the message header. */
    nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_mv (&msg->sphdr, &rep->backtrace);
    rep->flags &= ~NN_REP_INPROGRESS;

    /*  Send the reply. If it cannot be sent because of pushback,
        drop it silently. */
    rc = nn_xrep_send (&rep->xrep.sockbase, msg);
    errnum_assert (rc == 0 || rc == -EAGAIN, -rc);

    return 0;
}